

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void __thiscall asl::String::append(String *this,char *b,int n)

{
  int iVar1;
  int n_00;
  anon_union_16_2_78e7fdac_for_String_2 *paVar2;
  
  n_00 = this->_len + n;
  iVar1 = this->_size;
  if (n_00 < iVar1) {
    this->_len = n_00;
  }
  else {
    resize(this,n_00,true,true);
    iVar1 = this->_size;
    n_00 = this->_len;
  }
  if (iVar1 == 0) {
    paVar2 = &this->field_2;
  }
  else {
    paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  memcpy((char *)((long)paVar2 + ((long)n_00 - (long)n)),b,(long)n);
  paVar2->_space[this->_len] = '\0';
  return;
}

Assistant:

void String::append(const char* b, int n)
{
	if(_len+n >= _size)
		resize(_len+n);
	else
		_len += n;
	char* s = str();
	memcpy(s+_len-n, b, n);
	s[_len] = '\0';
}